

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitreader_buffer.c
# Opt level: O0

int16_t aom_rb_read_signed_primitive_refsubexpfin
                  (aom_read_bit_buffer *rb,uint16_t n,uint16_t k,int16_t ref)

{
  uint16_t uVar1;
  short in_CX;
  undefined2 in_DX;
  short in_SI;
  uint16_t scaled_n;
  uint16_t in_stack_ffffffffffffffea;
  uint16_t in_stack_ffffffffffffffec;
  uint16_t in_stack_ffffffffffffffee;
  
  uVar1 = aom_rb_read_primitive_refsubexpfin
                    ((aom_read_bit_buffer *)
                     CONCAT26(in_SI,CONCAT24(in_DX,CONCAT22(in_CX + in_SI + -1,in_SI * 2 + -1))),
                     in_stack_ffffffffffffffee,in_stack_ffffffffffffffec,in_stack_ffffffffffffffea);
  return (uVar1 - in_SI) + 1;
}

Assistant:

int16_t aom_rb_read_signed_primitive_refsubexpfin(
    struct aom_read_bit_buffer *rb, uint16_t n, uint16_t k, int16_t ref) {
  ref += n - 1;
  const uint16_t scaled_n = (n << 1) - 1;
  return aom_rb_read_primitive_refsubexpfin(rb, scaled_n, k, ref) - n + 1;
}